

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O2

int GetBBUserSeanet(SEANET *pSeanet)

{
  int iVar1;
  char *__s;
  int iVar2;
  double dVar3;
  int local_194;
  uchar reqbuf [14];
  CHRONO chrono;
  uchar databuf [264];
  
  reqbuf[8] = '\x02';
  reqbuf[9] = '\x03';
  reqbuf[10] = '\x18';
  reqbuf[0xb] = 0x80;
  reqbuf[0xc] = '\x02';
  reqbuf[0xd] = '\n';
  builtin_memcpy(reqbuf,"@0008\b",7);
  reqbuf[7] = 0xff;
  iVar1 = WriteAllRS232Port(&pSeanet->RS232Port,reqbuf,0xe);
  iVar2 = 1;
  if (iVar1 == 0) {
    memset(databuf,0,0x108);
    local_194 = 0;
    iVar1 = GetMsgSeanet(pSeanet,6,databuf,0x108,&local_194);
    __s = "A Seanet is not responding correctly. ";
    if (iVar1 == 0) {
      if (databuf[0x13] == '\x0f') {
        pSeanet->bDST = 1;
        pSeanet->bHalfDuplex = (uint)(databuf[0x92] == '\x01');
        memset(databuf,0,0x108);
        local_194 = 0;
        iVar1 = GetMsgSeanet(pSeanet,0x3f,databuf,0x108,&local_194);
        if (iVar1 != 0) goto LAB_00172740;
        memset(databuf,0,0x108);
        local_194 = 0;
        iVar1 = GetMsgSeanet(pSeanet,0x39,databuf,0x108,&local_194);
        if (iVar1 != 0) goto LAB_00172740;
      }
      else {
        pSeanet->bDST = 0;
        pSeanet->bHalfDuplex = (uint)(databuf[99] == '\x01');
      }
      StartChrono(&chrono);
      while (dVar3 = GetTimeElapsedChronoQuick(&chrono), dVar3 <= 10.0) {
        memset(databuf,0,0x108);
        local_194 = 0;
        iVar1 = GetLatestMsgSeanet(pSeanet,4,databuf,0x108,&local_194);
        if (iVar1 != 0) goto LAB_00172740;
        pSeanet->HeadInf = (uint)databuf[0x14];
        if (0xbf < databuf[0x14]) {
          return 0;
        }
      }
      __s = "Error reading data from a Seanet : BBUser timeout. ";
      iVar2 = 2;
    }
  }
  else {
    __s = "Error writing data to a Seanet. ";
  }
LAB_00172740:
  puts(__s);
  return iVar2;
}

Assistant:

inline int GetBBUserSeanet(SEANET* pSeanet)
{
	unsigned char reqbuf[] = {MESSAGE_HEADER_SEANET,'0','0','0','8',0x08,0x00,
		SERIAL_PORT_PROGRAM_NODE_NUMBER_SEANET,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,
		0x03,mtSendBBUser,0x80,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,MESSAGE_TERMINATOR_SEANET};
	unsigned char databuf[264];
	int nbdatabytes = 0;
	CHRONO chrono;

	// Send mtSendBBUser message.
	if (WriteAllRS232Port(&pSeanet->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Seanet. \n");
		return EXIT_FAILURE;
	}

	// Wait for a mtBBUserData message.
	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	//if (GetLatestMsgSeanet(pSeanet, mtBBUserData, databuf, sizeof(databuf), &nbdatabytes)
	//	!= EXIT_SUCCESS)
	if (GetMsgSeanet(pSeanet, mtBBUserData, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	if (databuf[19] == 15) 
	{
		pSeanet->bDST = TRUE;
		if (databuf[146] == 1) pSeanet->bHalfDuplex = TRUE; else pSeanet->bHalfDuplex = FALSE;

		// There is a risk here that mtFpgaCalibrationData and mtFpgaVersionData go as unexpected data 
		// for the mtBBUserData if the computer is too slow...
		// Should just wait for mtAlive message (instead of mtFpgaCalibrationData and mtFpgaVersionData) 
		// to be sure? Or should use GetMsgSeanet()?

		// mtFpgaCalibrationData and mtFpgaVersionData messages should follow the mtBBuserData reply.
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		//if (GetLatestMsgSeanet(pSeanet, mtFpgaCalibrationData, databuf, sizeof(databuf), &nbdatabytes)
		//	!= EXIT_SUCCESS)
		if (GetMsgSeanet(pSeanet, mtFpgaCalibrationData, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		//if (GetLatestMsgSeanet(pSeanet, mtFpgaVersionData, databuf, sizeof(databuf), &nbdatabytes)
		//	!= EXIT_SUCCESS)
		if (GetMsgSeanet(pSeanet, mtFpgaVersionData, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}
	}
	else
	{
		pSeanet->bDST = FALSE;
		if (databuf[99] == 1) pSeanet->bHalfDuplex = TRUE; else pSeanet->bHalfDuplex = FALSE;
	}

	StartChrono(&chrono);

	// Check mtAlive message HeadInf byte with NoParams (bit 6=1), SentCfg (bit 7=1).
	do
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_BBUSER_SEANET)
		{
			printf("Error reading data from a Seanet : BBUser timeout. \n");
			return EXIT_TIMEOUT;
		}

		// Wait for a mtAlive message. It should come every 1 second.
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		if (GetLatestMsgSeanet(pSeanet, mtAlive, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}

		// HeadInf.
		pSeanet->HeadInf = (unsigned char)databuf[20];

		//printf("mtAlive message databuf[20]=%#x\n", (int)databuf[20]);
	}
	while (!(databuf[20]&0x40)||!(databuf[20]&0x80));

	return EXIT_SUCCESS;
}